

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

bool Js::JavascriptLibrary::InitializeWeakSetPrototype
               (DynamicObject *weakSetPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  RuntimeFunction *pRVar2;
  StaticType *type;
  LiteralString *pLVar3;
  
  DeferredTypeHandlerBase::Convert(typeHandler,weakSetPrototype,mode,5,0);
  this = (((weakSetPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar1 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(weakSetPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (weakSetPrototype,0x67,(this->super_JavascriptLibraryBase).weakSetConstructor.ptr,6,0,0,
             0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptWeakSet::EntryInfo::Add,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0x4a);
  (*(weakSetPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(weakSetPrototype,0x4a,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptWeakSet::EntryInfo::Delete,1,
                      (DynamicObject *)0x0,(DynamicType *)0x0,0x6f);
  (*(weakSetPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(weakSetPrototype,0x6f,pRVar2,6,0,0,0);
  pRVar2 = DefaultCreateFunction
                     (this,(FunctionInfo *)JavascriptWeakSet::EntryInfo::Has,1,(DynamicObject *)0x0,
                      (DynamicType *)0x0,0xb4);
  (*(weakSetPrototype->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(weakSetPrototype,0xb4,pRVar2,6,0,0,0);
  if (((pSVar1->config).threadConfig)->m_ES6ToStringTag == true) {
    type = StringCache::GetStringTypeStatic(&this->stringCache);
    pLVar3 = LiteralString::New(type,L"WeakSet",7,this->recycler);
    (*(weakSetPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (weakSetPrototype,0x1b,pLVar3,2,0,0,0);
  }
  DynamicObject::SetHasNoEnumerableProperties(weakSetPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWeakSetPrototype(DynamicObject* weakSetPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(weakSetPrototype, mode, 5);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterWeakSet
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = weakSetPrototype->GetScriptContext();
        JavascriptLibrary* library = weakSetPrototype->GetLibrary();
        library->AddMember(weakSetPrototype, PropertyIds::constructor, library->weakSetConstructor);

        library->AddFunctionToLibraryObject(weakSetPrototype, PropertyIds::add, &JavascriptWeakSet::EntryInfo::Add, 1);
        library->AddFunctionToLibraryObject(weakSetPrototype, PropertyIds::delete_, &JavascriptWeakSet::EntryInfo::Delete, 1);
        library->AddFunctionToLibraryObject(weakSetPrototype, PropertyIds::has, &JavascriptWeakSet::EntryInfo::Has, 1);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(weakSetPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("WeakSet")), PropertyConfigurable);
        }

        weakSetPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }